

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

void __thiscall
pbrt::BVHLightSampler::BVHLightSampler
          (BVHLightSampler *this,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  Bounds3f *b1;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  LightBounds *pLVar9;
  LightHandle *first;
  size_t sVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  bvhLights;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_e0;
  pair<int,_pbrt::LightBounds> local_d8;
  optional<pbrt::LightBounds> lightBounds;
  float fStack_58;
  float local_54;
  Float FStack_50;
  float fStack_4c;
  float fStack_48;
  
  first = lights.ptr;
  lightBounds.optionalValue._0_8_ = alloc.memoryResource;
  pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
  vector<pbrt::LightHandle_const*>
            ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)this,
             first,first + lights.n,(polymorphic_allocator<pbrt::LightHandle> *)&lightBounds);
  auVar11._8_4_ = 0xff7fffff;
  auVar11._0_8_ = 0xff7fffffff7fffff;
  auVar11._12_4_ = 0xff7fffff;
  (this->infiniteLights).alloc.memoryResource = alloc.memoryResource;
  (this->infiniteLights).nStored = 0;
  (this->infiniteLights).ptr = (LightHandle *)0x0;
  (this->infiniteLights).nAlloc = 0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       0xff7fffff7f7fffff;
  uVar1 = vmovlps_avx(auVar11);
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar1 >> 0x20);
  (this->nodes).alloc.memoryResource = alloc.memoryResource;
  (this->nodes).nStored = 0;
  (this->nodes).ptr = (LightBVHNode *)0x0;
  (this->nodes).nAlloc = 0;
  HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
  ::HashMap(&this->lightToBitTrail,
            (polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>)
            alloc.memoryResource);
  b1 = &this->allLightBounds;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (sVar10 = 0; lights.n != sVar10; sVar10 = sVar10 + 1) {
    local_e0.bits =
         first[sVar10].
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    LightHandle::Bounds(&lightBounds,(LightHandle *)&local_e0);
    if (lightBounds.set == false) {
      pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::
      push_back(&this->infiniteLights,(LightHandle *)&local_e0);
    }
    else {
      pLVar9 = pstd::optional<pbrt::LightBounds>::value(&lightBounds);
      if (0.0 < pLVar9->phi) {
        pLVar9 = pstd::optional<pbrt::LightBounds>::value(&lightBounds);
        uVar2 = (pLVar9->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar3 = (pLVar9->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar1 = *(undefined8 *)&(pLVar9->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar4 = (pLVar9->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar5 = (pLVar9->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar6 = pLVar9->phi;
        uVar7 = (pLVar9->w).super_Tuple3<pbrt::Vector3,_float>.x;
        uVar8 = (pLVar9->w).super_Tuple3<pbrt::Vector3,_float>.y;
        local_d8.second._36_8_ = *(undefined8 *)&(pLVar9->w).super_Tuple3<pbrt::Vector3,_float>.z;
        local_d8.second.cosTheta_e = pLVar9->cosTheta_e;
        local_d8.second.twoSided = pLVar9->twoSided;
        local_d8.second._49_3_ = *(undefined3 *)&pLVar9->field_0x31;
        local_d8.first = (int)sVar10;
        local_d8.second.w.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar8;
        local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar1;
        local_d8.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
             (float)((ulong)uVar1 >> 0x20);
        local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
        local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar3;
        local_d8.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar4;
        local_d8.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar5;
        local_d8.second.phi = (Float)uVar6;
        local_d8.second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar7;
        std::
        vector<std::pair<int,pbrt::LightBounds>,std::allocator<std::pair<int,pbrt::LightBounds>>>::
        emplace_back<std::pair<int,pbrt::LightBounds>>
                  ((vector<std::pair<int,pbrt::LightBounds>,std::allocator<std::pair<int,pbrt::LightBounds>>>
                    *)&bvhLights,&local_d8);
        pLVar9 = pstd::optional<pbrt::LightBounds>::value(&lightBounds);
        Union<float>((Bounds3<float> *)&local_d8,b1,&pLVar9->bounds);
        (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
             local_d8.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
             local_d8.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        (b1->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)local_d8.first;
        (b1->pMin).super_Tuple3<pbrt::Point3,_float>.y =
             local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        *(ulong *)&(this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z,
                      local_d8.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y);
      }
    }
    pstd::optional<pbrt::LightBounds>::~optional(&lightBounds);
  }
  if (bvhLights.
      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      bvhLights.
      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    buildBVH((pair<int,_pbrt::LightBounds> *)&lightBounds,this,&bvhLights,0,
             (int)(((long)bvhLights.
                          super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)bvhLights.
                         super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38),0,0,alloc);
  }
  *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + (this->nodes).nStored * 0x20;
  std::
  _Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ::~_Vector_base(&bvhLights.
                   super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                 );
  return;
}

Assistant:

BVHLightSampler::BVHLightSampler(pstd::span<const LightHandle> lights, Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      infiniteLights(alloc),
      nodes(alloc),
      lightToBitTrail(alloc) {
    // Initialize _infiniteLights_ array and light BVH
    std::vector<std::pair<int, LightBounds>> bvhLights;
    for (size_t i = 0; i < lights.size(); ++i) {
        // Partition $i$th light into _infiniteLights_ or _bvhLights_
        LightHandle light = lights[i];
        pstd::optional<LightBounds> lightBounds = light.Bounds();
        if (!lightBounds)
            infiniteLights.push_back(light);
        else if (lightBounds->phi > 0) {
            bvhLights.push_back(std::make_pair(i, *lightBounds));
            allLightBounds = Union(allLightBounds, lightBounds->bounds);
        }
    }
    if (!bvhLights.empty())
        buildBVH(bvhLights, 0, bvhLights.size(), 0, 0, alloc);
    lightBVHBytes += nodes.size() * sizeof(LightBVHNode);
}